

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O1

int __thiscall
booster::aio::acceptor::accept(acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  error_category *peVar1;
  native_type __fd_00;
  int iVar2;
  int extraout_EAX;
  int *piVar3;
  undefined4 in_register_00000034;
  
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    iVar2 = ::accept(__fd_00,(sockaddr *)0x0,(socklen_t *)0x0);
    if (-1 < iVar2) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  if (iVar2 != -1) {
    basic_io_device::assign((basic_io_device *)CONCAT44(in_register_00000034,__fd),iVar2);
    return extraout_EAX;
  }
  piVar3 = __errno_location();
  peVar1 = syscat;
  iVar2 = *piVar3;
  __addr->sa_family = (short)iVar2;
  __addr->sa_data[0] = (char)((uint)iVar2 >> 0x10);
  __addr->sa_data[1] = (char)((uint)iVar2 >> 0x18);
  *(error_category **)(__addr->sa_data + 6) = peVar1;
  return iVar2;
}

Assistant:

void acceptor::accept(stream_socket &target,system::error_code &e)
{
	native_type new_fd = invalid_socket;
	#ifndef BOOSTER_WIN32
	for(;;) {
		new_fd = ::accept(native(),0,0);
		if(new_fd < 0 && errno==EINTR)
			continue;
		break;
	}
	#else
	new_fd = ::accept(native(),0,0);
	#endif

	if(new_fd == invalid_socket) {
		e=geterror();
		return;
	}

	target.assign(new_fd);
	return;
}